

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O1

void MWT::finish_example(vw *all,mwt *c,example *ec)

{
  cb_class *pcVar1;
  int *piVar2;
  float *pfVar3;
  size_t sVar4;
  float *pfVar5;
  float *pfVar6;
  int *piVar7;
  float loss;
  
  loss = 0.0;
  if (((c->learn == true) && (pcVar1 = c->observation, pcVar1 != (cb_class *)0x0)) &&
     (pcVar1->action == (uint32_t)(long)*(ec->pred).scalars._begin)) {
    loss = pcVar1->cost / pcVar1->probability;
  }
  shared_data::update(all->sd,ec->test_only,c->observation != (cb_class *)0x0,loss,1.0,
                      ec->num_features);
  piVar7 = (all->final_prediction_sink)._begin;
  piVar2 = (all->final_prediction_sink)._end;
  if (piVar7 != piVar2) {
    do {
      print_scalars(*piVar7,&(ec->pred).scalars,&ec->tag);
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar2);
  }
  if (c->learn != false) {
    pfVar3 = (ec->pred).scalars._begin;
    sVar4 = (ec->pred).scalars.erase_count;
    pfVar5 = (ec->pred).scalars._end;
    pfVar6 = (ec->pred).scalars.end_array;
    (ec->pred).multiclass = (uint32_t)(long)*pfVar3;
    CB::print_update(all,c->observation != (cb_class *)0x0,ec,(multi_ex *)0x0,false);
    (ec->pred).scalars._begin = pfVar3;
    (ec->pred).scalars._end = pfVar5;
    (ec->pred).scalars.end_array = pfVar6;
    (ec->pred).scalars.erase_count = sVar4;
  }
  VW::finish_example(all,ec);
  return;
}

Assistant:

void finish_example(vw& all, mwt& c, example& ec)
{
  float loss = 0.;
  if (c.learn)
    if (c.observation != nullptr)
      loss = get_unbiased_cost(c.observation, (uint32_t)ec.pred.scalars[0]);
  all.sd->update(ec.test_only, c.observation != nullptr, loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink) print_scalars(sink, ec.pred.scalars, ec.tag);

  if (c.learn)
  {
    v_array<float> temp = ec.pred.scalars;
    ec.pred.multiclass = (uint32_t)temp[0];
    CB::print_update(all, c.observation != nullptr, ec, nullptr, false);
    ec.pred.scalars = temp;
  }
  VW::finish_example(all, ec);
}